

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prov_security_factory.c
# Opt level: O1

void prov_dev_security_deinit(void)

{
  char *pcVar1;
  
  if (g_symm_key != (char *)0x0) {
    free(g_symm_key);
    g_symm_key = (char *)0x0;
  }
  if (g_symm_key_reg_name != (char *)0x0) {
    free(g_symm_key_reg_name);
    g_symm_key_reg_name = (char *)0x0;
  }
  deinitialize_hsm_system();
  pcVar1 = iothub_security_get_symmetric_key();
  if (pcVar1 == (char *)0x0) {
    pcVar1 = iothub_security_get_symm_registration_name();
    if (pcVar1 == (char *)0x0) {
      return;
    }
  }
  iothub_security_deinit();
  return;
}

Assistant:

void prov_dev_security_deinit(void)
{
    if (g_symm_key != NULL)
    {
        free(g_symm_key);
        g_symm_key = NULL;
    }
    if (g_symm_key_reg_name != NULL)
    {
        free(g_symm_key_reg_name);
        g_symm_key_reg_name = NULL;
    }
    deinitialize_hsm_system();
    if (iothub_security_get_symmetric_key() != NULL || iothub_security_get_symm_registration_name() != NULL)
    {
        // Clear out iothub info
        iothub_security_deinit();
    }
}